

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cpp
# Opt level: O1

void __thiscall duckdb::Executor::Flush(Executor *this,ThreadContext *thread_context)

{
  __int_type _Var1;
  long lVar2;
  QueryProfiler *pQVar3;
  undefined1 auVar4 [16];
  shared_ptr<duckdb::QueryProfiler,_true> global_profiler;
  shared_ptr<duckdb::QueryProfiler,_true> local_28;
  double local_18;
  
  local_28.internal.super___shared_ptr<duckdb::QueryProfiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->profiler).internal.
       super___shared_ptr<duckdb::QueryProfiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_28.internal.super___shared_ptr<duckdb::QueryProfiler,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (this->profiler).internal.
       super___shared_ptr<duckdb::QueryProfiler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_28.internal.super___shared_ptr<duckdb::QueryProfiler,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_28.internal.super___shared_ptr<duckdb::QueryProfiler,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_28.internal.super___shared_ptr<duckdb::QueryProfiler,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_28.internal.super___shared_ptr<duckdb::QueryProfiler,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_28.internal.super___shared_ptr<duckdb::QueryProfiler,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  if (local_28.internal.super___shared_ptr<duckdb::QueryProfiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      != (element_type *)0x0) {
    pQVar3 = shared_ptr<duckdb::QueryProfiler,_true>::operator->(&local_28);
    QueryProfiler::Flush(pQVar3,&thread_context->profiler);
    _Var1 = (this->blocked_thread_time).super___atomic_base<unsigned_long>._M_i;
    pQVar3 = shared_ptr<duckdb::QueryProfiler,_true>::operator->(&local_28);
    lVar2 = _Var1 * 0x14;
    auVar4._8_4_ = (int)((ulong)lVar2 >> 0x20);
    auVar4._0_8_ = lVar2;
    auVar4._12_4_ = 0x45300000;
    local_18 = ((auVar4._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0)) / 1000.0;
    QueryProfiler::SetInfo(pQVar3,&local_18);
  }
  if (local_28.internal.super___shared_ptr<duckdb::QueryProfiler,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.internal.
               super___shared_ptr<duckdb::QueryProfiler,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return;
}

Assistant:

void Executor::Flush(ThreadContext &thread_context) {
	static constexpr std::chrono::milliseconds WAIT_TIME_MS = std::chrono::milliseconds(WAIT_TIME);
	auto global_profiler = profiler;
	if (global_profiler) {
		global_profiler->Flush(thread_context.profiler);

		auto blocked_time = blocked_thread_time.load();
		global_profiler->SetInfo(double(blocked_time * WAIT_TIME_MS.count()) / 1000);
	}
}